

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManSortCubes(char **pCubes,int nCubes,int nVars)

{
  char *pcVar1;
  int iVar2;
  int local_2c;
  int local_28;
  int best_i;
  int j;
  int i;
  char *pTemp;
  int nVars_local;
  int nCubes_local;
  char **pCubes_local;
  
  for (best_i = 0; best_i < nCubes + -1; best_i = best_i + 1) {
    local_2c = best_i;
    local_28 = best_i;
    while (local_28 = local_28 + 1, local_28 < nCubes) {
      iVar2 = memcmp(pCubes[local_28],pCubes[local_2c],(long)nVars);
      if (iVar2 < 0) {
        local_2c = local_28;
      }
    }
    pcVar1 = pCubes[best_i];
    pCubes[best_i] = pCubes[local_2c];
    pCubes[local_2c] = pcVar1;
  }
  return;
}

Assistant:

void Bbl_ManSortCubes( char ** pCubes, int nCubes, int nVars )
{
    char * pTemp;
    int i, j, best_i;
    for ( i = 0; i < nCubes-1; i++ )
    {
        best_i = i;
        for (j = i+1; j < nCubes; j++)
            if ( memcmp( pCubes[j], pCubes[best_i], (size_t)nVars ) < 0 )
                best_i = j;
        pTemp = pCubes[i]; pCubes[i] = pCubes[best_i]; pCubes[best_i] = pTemp;
    }
}